

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

MemoryObject * dg::pta::PointerAnalysisFSInv::getOrCreateMO(MemoryMapT *mm,PSNode *target)

{
  bool bVar1;
  pointer pMVar2;
  MemoryObject *this;
  unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *moptr;
  
  pMVar2 = (pointer)std::
                    map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                    ::operator[](mm,(key_type *)target);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                      *)0x1a2e2c);
  if (!bVar1) {
    this = (MemoryObject *)operator_new(0x38);
    MemoryObject::MemoryObject(this,(PSNode *)pMVar2);
    std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::reset
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               this,pMVar2);
  }
  pMVar2 = std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::get
                     ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                       *)0x1a2e6d);
  return pMVar2;
}

Assistant:

static MemoryObject *getOrCreateMO(MemoryMapT *mm, PSNode *target) {
        std::unique_ptr<MemoryObject> &moptr = (*mm)[target];
        if (!moptr)
            moptr.reset(new MemoryObject(target));

        assert(mm->find(target) != mm->end());
        return moptr.get();
    }